

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

void __thiscall Cache::setByte(Cache *this,uint32_t addr,uint8_t val,uint32_t *cycles)

{
  uint32_t *puVar1;
  ulong *puVar2;
  pointer pBVar3;
  Cache *this_00;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  
  this->reference_cnt = this->reference_cnt + 1;
  puVar1 = &(this->statistics).write_cnt;
  *puVar1 = *puVar1 + 1;
  uVar5 = getBlockId(this,addr);
  if (uVar5 == 0xffffffff) {
    puVar1 = &(this->statistics).miss_cnt;
    *puVar1 = *puVar1 + 1;
    if (this->write_allocate == false) {
      if (this->lower_cache == (Cache *)0x0) {
        MemoryManager::setByteNoCache(this->memory,addr,val);
        puVar1 = &(this->statistics).cycle_cnt;
        *puVar1 = *puVar1 + 100;
        if (cycles != (uint32_t *)0x0) {
          *cycles = *cycles + 100;
        }
      }
      else {
        setByte(this->lower_cache,addr,val,cycles);
        if (cycles != (uint32_t *)0x0) {
          puVar1 = &(this->statistics).cycle_cnt;
          *puVar1 = *puVar1 + *cycles;
        }
      }
    }
    else {
      if (this->bypass == true) {
        uVar5 = getId(this,addr);
        bVar4 = cacheSetFull(this,uVar5);
        if (bVar4) {
          uVar5 = getId(this,addr);
          uVar6 = getTag(this,addr);
          uVar7 = 0;
          do {
            if (this->mct_size == uVar7) {
              this_00 = this->lower_cache;
              if (this_00 == (Cache *)0x0) {
                if (cycles != (uint32_t *)0x0) {
                  *cycles = *cycles + 100;
                }
                puVar1 = &(this->statistics).cycle_cnt;
                *puVar1 = *puVar1 + 100;
                MemoryManager::setByteNoCache(this->memory,addr,val);
              }
              else {
                puVar1 = &(this->statistics).cycle_cnt;
                *puVar1 = *puVar1 + (this_00->policy).hit_latency;
                setByte(this_00,addr,val,cycles);
              }
              uVar5 = getId(this,addr);
              MCTUpdate(this,uVar5,addr);
              return;
            }
            puVar2 = this->mct[uVar5] + uVar7;
          } while ((*puVar2 != 0xffffffffffffffff) && (uVar7 = uVar7 + 1, *puVar2 != (ulong)uVar6));
        }
        uVar5 = getId(this,addr);
        MCTUpdate(this,uVar5,addr);
      }
      loadBlockFromLowerLevel(this,addr,cycles);
      if (this->pre_fetch == true) {
        preFetch(this,addr);
      }
      uVar5 = getBlockId(this,addr);
      if (uVar5 == 0xffffffff) {
        fwrite("Error: data should in top level cache, but it seems not\n",0x38,1,_stderr);
        exit(-1);
      }
      uVar6 = getOffset(this,addr);
      (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
      super__Vector_impl_data._M_start[(int)uVar5].dirty = true;
      PLRUUpdate(this,uVar5);
      pBVar3 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar3[(int)uVar5].last_reference = this->reference_cnt;
      *(uint8_t *)
       (*(long *)&pBVar3[(int)uVar5].data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + (ulong)uVar6) = val;
    }
  }
  else {
    uVar6 = getOffset(this,addr);
    puVar1 = &(this->statistics).hit_cnt;
    *puVar1 = *puVar1 + 1;
    puVar1 = &(this->statistics).cycle_cnt;
    *puVar1 = *puVar1 + (this->policy).hit_latency;
    (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
    super__Vector_impl_data._M_start[(int)uVar5].dirty = true;
    PLRUUpdate(this,uVar5);
    pBVar3 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar3[(int)uVar5].last_reference = this->reference_cnt;
    *(uint8_t *)
     (*(long *)&pBVar3[(int)uVar5].data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + (ulong)uVar6) = val;
    if (this->write_back == false) {
      writeBlockToLowerLevel
                (this,(this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>
                      ._M_impl.super__Vector_impl_data._M_start + (int)uVar5,cycles);
    }
    if (cycles != (uint32_t *)0x0) {
      *cycles = *cycles + (this->policy).hit_latency;
    }
  }
  return;
}

Assistant:

void Cache::setByte(uint32_t addr, uint8_t val, uint32_t *cycles) {
    this->reference_cnt++;
    this->statistics.write_cnt++;
    int block_id;
    if ((block_id = this->getBlockId(addr)) != -1) {
        //in cache
        uint32_t offset = this->getOffset(addr);
        this->statistics.hit_cnt++;
        this->statistics.cycle_cnt += this->policy.hit_latency;
        this->blocks[block_id].dirty = true;
        this->PLRUUpdate(block_id);
        this->blocks[block_id].last_reference = this->reference_cnt;
        this->blocks[block_id].data[offset] = val;
        if (!this->write_back) {
            this->writeBlockToLowerLevel(this->blocks[block_id], cycles);
//            this->statistics.cycle_cnt += this->policy.miss_latency;
        }
        if (cycles) {
            *cycles += this->policy.hit_latency;
        }
        return;
    }

    this->statistics.miss_cnt++;
//    this->statistics.cycle_cnt += this->policy.miss_latency;

    if (!this->write_allocate) {
        if (this->lower_cache == nullptr) {
            this->memory->setByteNoCache(addr, val);
            this->statistics.cycle_cnt += 100;
            if (cycles)
                *cycles += 100;
        } else {
            this->lower_cache->setByte(addr, val, cycles);
            if (cycles)
                this->statistics.cycle_cnt += *cycles;
        }
    } else {
        if (this->bypass) {
            if (this->cacheSetFull(getId(addr))) {
                bool next_level = true;
                uint32_t set_id = getId(addr);
                uint32_t tag = getTag(addr);
                for (int tmp = 0; tmp < this->mct_size; tmp++) {
                    if (mct[set_id][tmp] == (uint64_t) -1 || mct[set_id][tmp] == tag) {
                        next_level = false;
                        break;
                    }
                }
                if (next_level) {
                    if (this->lower_cache == nullptr) {
                        if (cycles)
                            *cycles += 100;
                        this->statistics.cycle_cnt += 100;
                        this->memory->setByteNoCache(addr, val);
                    } else {
                        this->statistics.cycle_cnt += this->lower_cache->policy.hit_latency;
                        this->lower_cache->setByte(addr, val, cycles);
                    }
                    MCTUpdate(getId(addr), addr);
                    return;
                }
            }
            MCTUpdate(getId(addr), addr);
        }
        this->loadBlockFromLowerLevel(addr, cycles);
        if (this->pre_fetch)
            preFetch(addr);
        if ((block_id = this->getBlockId(addr)) != -1) {
            uint32_t offset = this->getOffset(addr);
            this->blocks[block_id].dirty = true;
            this->PLRUUpdate(block_id);
            this->blocks[block_id].last_reference = this->reference_cnt;
            this->blocks[block_id].data[offset] = val;
//            if (cycles)
//                *cycles += this->policy.hit_latency;
            return;
        } else {
            fprintf(stderr, "Error: data should in top level cache, but it seems not\n");
            exit(-1);
        }
    }
}